

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall
CVmObjGramProd::enqueue_alts
          (CVmObjGramProd *this,CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,
          size_t start_tok_pos,CVmGramProdState *enclosing_state,CVmGramProdQueue *queues,
          vm_obj_id_t self,int circ_only,CVmGramProdMatch *circ_match,CVmObjDict *dict)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  vm_obj_id_t vVar8;
  int iVar9;
  vm_gram_ext *pvVar10;
  ulong in_RCX;
  long in_RDX;
  CVmGramProdState *in_RDI;
  ulong in_R8;
  vm_obj_id_t in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  CVmGramProdMatch *match_1;
  CVmGramProdState *state;
  size_t rem;
  vm_prop_id_t *prop;
  vm_val_t match_result;
  int ignore_item;
  int match_star;
  int match;
  size_t cur_alt_tok;
  int prod_before;
  int is_circ;
  int found_mismatch;
  size_t alt_tok_cnt;
  vmgram_tok_info *tokp;
  vmgram_tok_info *first_tokp;
  size_t tok_idx;
  vm_obj_id_t comparator;
  int has_circ;
  int need_to_clone;
  size_t i;
  vmgram_alt_info **altp;
  undefined2 in_stack_ffffffffffffff18;
  vm_prop_id_t in_stack_ffffffffffffff1a;
  int in_stack_ffffffffffffff1c;
  vm_val_t *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff28;
  vm_obj_id_t vVar11;
  vmgramprod_tok *in_stack_ffffffffffffff38;
  CVmGramProdState *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  CVmGramProdQueue *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  ulong local_88;
  vmgram_tok_info *local_68;
  ulong local_58;
  size_t local_40;
  vmgram_alt_info **local_38;
  
  get_ext((CVmObjGramProd *)in_RDI);
  if (in_stack_00000028 == 0) {
    vVar8 = 0;
  }
  else {
    vVar8 = CVmObjDict::get_comparator((CVmObjDict *)0x3581f7);
  }
  vVar11 = vVar8;
  pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
  if ((((byte)pvVar10->field_0x14 >> 1 & 1) == 0) ||
     (pvVar10 = get_ext((CVmObjGramProd *)in_RDI), pvVar10->comparator_ != vVar8)) {
    cache_hashes((CVmObjGramProd *)in_stack_ffffffffffffff40,(CVmObjDict *)in_stack_ffffffffffffff38
                );
  }
  pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
  local_38 = pvVar10->alts_;
  pvVar10 = get_ext((CVmObjGramProd *)in_RDI);
  local_40 = pvVar10->alt_cnt_;
  do {
    if (local_40 == 0) {
      return;
    }
    local_68 = (*local_38)->toks;
    uVar1 = (*local_38)->tok_cnt;
    bVar7 = false;
    uVar2 = in_stack_ffffffffffffff28 & 0xffffff;
    if ((uVar1 != 0) && (uVar2 = in_stack_ffffffffffffff28 & 0xffffff, local_68->typ == '\x01')) {
      uVar2 = CONCAT13((local_68->typinfo).prod_obj == in_stack_00000010,
                       (int3)in_stack_ffffffffffffff28);
    }
    in_stack_ffffffffffffff28 = uVar2;
    uVar2 = in_stack_ffffffffffffff28 >> 0x18;
    bVar4 = false;
    local_88 = 0;
    local_58 = in_R8;
LAB_00358347:
    if (local_88 < uVar1) {
      bVar3 = false;
      bVar6 = false;
      bVar5 = false;
      do {
        in_stack_ffffffffffffff20 = (vm_val_t *)(ulong)(local_68->typ - 1);
        switch(in_stack_ffffffffffffff20) {
        case (vm_val_t *)0x0:
          if (((uVar2 == 0) || (in_stack_00000018 == 0)) || (local_88 != 0)) {
            bVar4 = true;
          }
          bVar5 = true;
          break;
        case (vm_val_t *)0x1:
          if ((local_58 < in_RCX) &&
             (iVar9 = find_prop_in_tok((vmgramprod_tok *)(in_RDX + local_58 * 0x40),
                                       (local_68->typinfo).speech_prop), iVar9 != 0)) {
            bVar3 = true;
          }
          break;
        case (vm_val_t *)0x2:
          if ((((local_58 < in_RCX) && (*(long *)(in_RDX + local_58 * 0x40 + 0x18) != 0)) &&
              ((local_68->typinfo).lit.hash == *(uint *)(in_RDX + local_58 * 0x40 + 0x28))) &&
             (iVar9 = tok_equals_lit(in_stack_ffffffffffffff38,(char *)in_RDI,
                                     CONCAT44(vVar11,in_stack_ffffffffffffff28),
                                     (CVmObjDict *)in_stack_ffffffffffffff20,
                                     (vm_val_t *)
                                     CONCAT44(in_stack_ffffffffffffff1c,
                                              CONCAT22(in_stack_ffffffffffffff1a,
                                                       in_stack_ffffffffffffff18))), iVar9 != 0)) {
            bVar3 = true;
          }
          break;
        case (vm_val_t *)0x3:
          if ((local_58 < in_RCX) &&
             (*(ulong *)(in_RDX + local_58 * 0x40 + 0x10) == (ulong)(local_68->typinfo).prod_obj)) {
            bVar3 = true;
          }
          break;
        case (vm_val_t *)0x4:
          bVar3 = true;
          bVar6 = true;
          local_58 = in_RCX;
          break;
        case (vm_val_t *)0x5:
          if (local_58 < in_RCX) {
            bVar3 = false;
            in_stack_ffffffffffffff50 = (CVmGramProdQueue *)(local_68->typinfo).nspeech.props;
            for (in_stack_ffffffffffffff48 = (local_68->typinfo).nspeech.cnt;
                in_stack_ffffffffffffff48 != 0;
                in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 - 1) {
              iVar9 = find_prop_in_tok((vmgramprod_tok *)(in_RDX + local_58 * 0x40),
                                       *(vm_prop_id_t *)&in_stack_ffffffffffffff50->work_queue_);
              if (iVar9 != 0) {
                bVar3 = true;
                break;
              }
              in_stack_ffffffffffffff50 =
                   (CVmGramProdQueue *)((long)&in_stack_ffffffffffffff50->work_queue_ + 2);
            }
          }
          else {
            bVar3 = false;
          }
        }
        if ((((bVar3) || (!bVar4)) || (bVar5)) || (in_RCX <= local_58)) goto LAB_00358647;
        local_58 = local_58 + 1;
      } while( true );
    }
LAB_003586bc:
    if ((!bVar7) &&
       ((((in_stack_00000018 == 0 && (uVar2 == 0)) || ((in_stack_00000018 != 0 && (uVar2 != 0)))) &&
        (in_stack_ffffffffffffff40 =
              enqueue_new_state((CVmGramProdMem *)in_stack_ffffffffffffff40,
                                (size_t)in_stack_ffffffffffffff38,in_RDI,
                                (vmgram_alt_info *)CONCAT44(vVar11,in_stack_ffffffffffffff28),
                                (vm_obj_id_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                (int *)CONCAT44(in_stack_ffffffffffffff1c,
                                                CONCAT22(in_stack_ffffffffffffff1a,
                                                         in_stack_ffffffffffffff18)),
                                in_stack_ffffffffffffff50,in_stack_ffffffffffffff58),
        in_stack_00000018 != 0)))) {
      in_stack_ffffffffffffff38 =
           (vmgramprod_tok *)
           CVmGramProdMatch::alloc
                     ((CVmGramProdMem *)in_RDI,CONCAT44(vVar11,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff1a,
                      (vm_obj_id_t)((ulong)*(undefined8 *)(in_stack_00000020 + 0x30) >> 0x20),
                      (CVmGramProdMatch **)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff40->match_list_[0] = (CVmGramProdMatch *)in_stack_ffffffffffffff38;
      in_stack_ffffffffffffff40->alt_pos_ = 1;
    }
    local_40 = local_40 - 1;
    local_38 = local_38 + 1;
  } while( true );
LAB_00358647:
  if (bVar3) {
    if ((!bVar6) && (local_58 < in_RCX)) {
      local_58 = local_58 + 1;
    }
  }
  else if (!bVar5) {
    bVar7 = true;
    goto LAB_003586bc;
  }
  local_88 = local_88 + 1;
  local_68 = local_68 + 1;
  goto LAB_00358347;
}

Assistant:

void CVmObjGramProd::enqueue_alts(VMG_ CVmGramProdMem *mem,
                                  const vmgramprod_tok *tok,
                                  size_t tok_cnt, size_t start_tok_pos,
                                  CVmGramProdState *enclosing_state,
                                  CVmGramProdQueue *queues, vm_obj_id_t self,
                                  int circ_only,
                                  CVmGramProdMatch *circ_match,
                                  CVmObjDict *dict)
{
    vmgram_alt_info *const *altp;
    size_t i;
    int need_to_clone;
    int has_circ;
    vm_obj_id_t comparator;

    /* 
     *   We don't need to clone the enclosing state until we've set up one
     *   new state referring back to it.  However, if we're doing circular
     *   alternatives, the enclosing state could also be enqueued
     *   separately as its own state, so do clone all required copies in
     *   this case.  
     */
    need_to_clone = circ_only;

    /* note whether or not we have any circular alternatives */
    has_circ = get_ext()->has_circular_alt;

    /* 
     *   Cache hash values for all of our literals.  We need to do this if we
     *   haven't done it before, or if the comparator associated with the
     *   dictionary is different than it was last time we cached the values. 
     */
    comparator = (dict != 0 ? dict->get_comparator() : VM_INVALID_OBJ);
    if (!get_ext()->hashes_cached_ || get_ext()->comparator_ != comparator)
        cache_hashes(vmg_ dict);

    /* 
     *   run through our alternatives and enqueue each one that looks
     *   plausible 
     */
    for (altp = get_ext()->alts_, i = get_ext()->alt_cnt_ ; i != 0 ;
         --i, ++altp)
    {
        /* start at the first token remaining in the string */
        size_t tok_idx = start_tok_pos;

        /* get the first token for this alternative */
        vmgram_tok_info *first_tokp = (*altp)->toks;

        /* start at the first token */
        vmgram_tok_info *tokp = first_tokp;

        /* get the number of tokens in the alternative */
        size_t alt_tok_cnt = (*altp)->tok_cnt;
        
        /* presume we will find no mismatches in this check */
        int found_mismatch = FALSE;

        /* 
         *   note whether this alternative is a direct circular reference
         *   or not (it is directly circular if the first token points
         *   back to this same production) 
         */
        int is_circ = (alt_tok_cnt != 0
                       && tokp->typ == VMGRAM_MATCH_PROD
                       && tokp->typinfo.prod_obj == self);
        
        /* 
         *   we don't have a production before the current item (this is
         *   important because it determines whether we must consider the
         *   current token or any following token when trying to match a
         *   literal, part of speech, or token type) 
         */
        int prod_before = FALSE;

        /* scan the tokens in the alternative */
        for (size_t cur_alt_tok = 0 ; cur_alt_tok < alt_tok_cnt ;
             ++cur_alt_tok, ++tokp)
        {
            int match;
            int match_star;
            int ignore_item;
            vm_val_t match_result;

            /* presume we won't find a match */
            match = FALSE;
            match_star = FALSE;

            /* presume we won't be able to ignore the item */
            ignore_item = FALSE;

            /* 
             *   Try to find a match to the current alternative item.  If
             *   we've already found a mismatch, don't bother, since we need
             *   no further evidence to skip this alternative; in this case
             *   we're still looping over the alternative items simply to
             *   find the beginning of the next alternative.  
             */
            for ( ; !found_mismatch ; ++tok_idx)
            {
                /* see what kind of item we have */
                switch(tokp->typ)
                {
                case VMGRAM_MATCH_PROD:
                    /* 
                     *   We can't rule out a production without checking
                     *   it fully, which we're not doing on this pass;
                     *   however, note that we found a production, because
                     *   it means that we must from now on try skipping
                     *   any number of tokens before ruling out a match on
                     *   other grounds, since the production could
                     *   potentially match any number of tokens.
                     *   
                     *   If we're doing circular matches only, and this is
                     *   a circular production, and we're on the first
                     *   token in our list, we already know it matches, so
                     *   don't even count it as a production before the
                     *   item.  
                     */
                    if (is_circ && circ_only && cur_alt_tok == 0)
                    {
                        /* 
                         *   ignore the fact that it's a production, since
                         *   we already know it matches - we don't want to
                         *   be flexible about tokens following this item
                         *   since we know the exact number that match it 
                         */
                    }
                    else
                    {
                        /* note the production item */
                        prod_before = TRUE;
                    }

                    /* 
                     *   we can ignore this item for the purposes of
                     *   detecting a mismatch, because we can't tell
                     *   during this superficial scan whether it matches 
                     */
                    ignore_item = TRUE;
                    break;
                
                case VMGRAM_MATCH_SPEECH:
                    /* we must match a part of speech */
                    if (tok_idx < tok_cnt
                        && find_prop_in_tok(&tok[tok_idx],
                                            tokp->typinfo.speech_prop))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;

                case VMGRAM_MATCH_NSPEECH:
                    /* multiple parts of speech */
                    if (tok_idx < tok_cnt)
                    {
                        vm_prop_id_t *prop;
                        size_t rem;

                        /* presume we won't find a match */
                        match = FALSE;

                        /* check each item in the list */
                        for (prop = tokp->typinfo.nspeech.props,
                             rem = tokp->typinfo.nspeech.cnt ; rem != 0 ;
                             --rem, ++prop)
                        {
                            /* if this one matches, we have a match */
                            if (find_prop_in_tok(&tok[tok_idx], *prop))
                            {
                                /* note the match */
                                match = TRUE;

                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    else
                    {
                        /* we're out of tokens, so we have no match */
                        match = FALSE;
                    }
                    break;
                    
                case VMGRAM_MATCH_LITERAL:
                    /* 
                     *   Match a literal.  Compare the hash values first,
                     *   since a negative match on the hash values will tell
                     *   us for sure that the text won't match; since not
                     *   matching is by far the most common case, this saves
                     *   us the work of doing full string comparisons most of
                     *   the time. 
                     */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].txt_ != 0
                        && tokp->typinfo.lit.hash == tok[tok_idx].hash_
                        && tok_equals_lit(vmg_ &tok[tok_idx],
                                          tokp->typinfo.lit.str,
                                          tokp->typinfo.lit.len,
                                          dict, &match_result))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;
                
                case VMGRAM_MATCH_TOKTYPE:
                    /* we must match a token type */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].typ_ == tokp->typinfo.toktyp_enum)
                        match = TRUE;
                    break;

                case VMGRAM_MATCH_STAR:
                    /* consume everything remaining on the line */
                    tok_idx = tok_cnt;

                    /* this is a match */
                    match = TRUE;
                    match_star = TRUE;
                    break;
                }

                /* if we found a match, we can stop scanning now */
                if (match)
                    break;

                /* 
                 *   we didn't match this token - if we have a production
                 *   before this point, we must keep scanning token, since
                 *   the production could end up matching any number of
                 *   tokens; if we don't have a production item, though,
                 *   we don't need to look any further, and we can rule
                 *   out this alternative immediately 
                 */
                if (!prod_before)
                    break;

                /* 
                 *   if we're ignoring this item (because we can't decide
                 *   now whether it's a match or not, and hence can't rule
                 *   it out), don't scan any tokens for the item 
                 */
                if (ignore_item)
                    break;

                /* 
                 *   if we didn't find a match, and we're out of tokens,
                 *   stop looking - we have no more tokens to look at to
                 *   find a match 
                 */
                if (!match && tok_idx >= tok_cnt)
                    break;
            }

            /* check to see if we found a match */
            if (match)
            {
                /* 
                 *   we found a match - skip the current token (unless we
                 *   matched a '*' item, in which case we've already
                 *   consumed all remaining tokens) 
                 */
                if (!match_star && tok_idx < tok_cnt)
                    ++tok_idx;
            }
            else if (!ignore_item)
            {
                /* 
                 *   we didn't match, and we can't ignore this item - note
                 *   that the alternative does not match 
                 */
                found_mismatch = TRUE;

                /* finish up with this alternative and proceed to the next */
                break;
            }
        }

        /* 
         *   If we didn't find a reason to rule out this alternative,
         *   enqueue the alternative.  Never enqueue circular references,
         *   unless we're ONLY enqueuing circular references.
         */
        if (!found_mismatch
            && ((!circ_only && !is_circ)
                || (circ_only && is_circ)))
        {
            CVmGramProdState *state;
            
            /* create and enqueue the new state */
            state = enqueue_new_state(mem, start_tok_pos, enclosing_state,
                                      *altp, self, &need_to_clone, queues,
                                      has_circ);

            /* 
             *   if we are enqueuing circular references, we already have
             *   a match for the first (circular) token, so fill it in 
             */
            if (circ_only)
            {
                CVmGramProdMatch *match;
                
                /* create a match for the alternative */
                match = CVmGramProdMatch::
                        alloc(mem, 0, 0, FALSE, first_tokp->prop,
                              circ_match->proc_obj_,
                              circ_match->sub_match_list_,
                              circ_match->sub_match_cnt_);

                /* set the first match in the token */
                state->match_list_[0] = match;

                /* set up at the second token */
                state->alt_pos_ = 1;
            }
        }
    }
}